

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O2

void __thiscall
amrex::FaceDivFree::interp_arr
          (FaceDivFree *this,Array<FArrayBox_*,_3> *crse,int crse_comp,Array<FArrayBox_*,_3> *fine,
          int fine_comp,int ncomp,Box *fine_region,IntVect *ratio,Array<IArrayBox_*,_3> *solve_mask,
          Geometry *param_9,Geometry *fine_geom,
          Vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
          *param_11,int param_12,int param_13,RunOn runon)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  undefined8 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  double *pdVar29;
  double *pdVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  double *pdVar35;
  uint uVar36;
  IndexType IVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  double *pdVar41;
  double *pdVar42;
  double *pdVar43;
  long lVar44;
  double *pdVar45;
  int iVar46;
  int iVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  double *pdVar51;
  long lVar52;
  long lVar53;
  double *pdVar54;
  long lVar55;
  long lVar56;
  double *pdVar57;
  double *pdVar58;
  double *pdVar59;
  double *pdVar60;
  double *pdVar61;
  long lVar62;
  long lVar63;
  double *pdVar64;
  long lVar65;
  int *piVar66;
  int iVar67;
  double *pdVar68;
  double *pdVar69;
  long lVar70;
  double *pdVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  double *pdVar77;
  double *pdVar78;
  bool bVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  long local_718;
  long local_6f8;
  undefined8 uStack_6f0;
  Box result;
  long local_6b8;
  double *local_6a8;
  double *local_6a0;
  long local_678;
  double dStack_670;
  int local_640;
  int local_63c;
  long local_618;
  int local_5e8;
  Box bx_2;
  Box bx_1;
  Box bx;
  Array<IndexType,_3> types;
  double dStack_4c0;
  double *local_4a0;
  double *local_498;
  double *local_490;
  double *local_488;
  double *local_480;
  double *local_478;
  double *local_470;
  double *local_468;
  double *local_460;
  double *local_458;
  double *local_450;
  double *local_448;
  double *local_440;
  double *local_438;
  double *local_420;
  double *local_418;
  double *local_410;
  double *local_408;
  double *local_3f0;
  double *local_3e8;
  double *local_3e0;
  double *local_3d8;
  GpuArray<amrex::Array4<double>,_3U> finearr;
  GpuArray<amrex::Array4<const_double>,_3U> crsearr;
  GpuArray<amrex::Array4<const_int>,_3U> maskarr;
  
  local_6f8._0_4_ = ncomp;
  types._M_elems[2].itype = 0;
  types._M_elems[0].itype = 0;
  types._M_elems[1].itype = 0;
  for (lVar32 = 0; lVar32 != 3; lVar32 = lVar32 + 1) {
    types._M_elems[lVar32].itype = types._M_elems[lVar32].itype | 1 << ((byte)lVar32 & 0x1f);
  }
  if (((ratio->vect[0] == 2) && (ratio->vect[1] == 2)) && (ratio->vect[2] == 2)) {
    iVar67 = 2;
    iVar25 = iVar67;
  }
  else {
    Assert_host("ratio == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/AmrCore/AMReX_Interpolater.cpp"
                ,0x3a5,(char *)0x0);
    iVar25 = ratio->vect[0];
    iVar67 = ratio->vect[1];
  }
  lVar32 = *(long *)(fine_region->smallend).vect;
  lVar26 = *(long *)((fine_region->smallend).vect + 2);
  lVar72 = *(long *)(fine_region->bigend).vect;
  uVar16 = *(undefined8 *)((fine_region->bigend).vect + 2);
  result.bigend.vect[1] = (int)((ulong)lVar72 >> 0x20);
  result.bigend.vect[2] = (int)uVar16;
  result.btype.itype = SUB84(uVar16,4);
  result.smallend.vect[2] = (int)lVar26;
  result.bigend.vect[0] = (int)((ulong)lVar26 >> 0x20);
  result.smallend.vect[1] = (int)((ulong)lVar32 >> 0x20);
  uVar23 = result.smallend.vect[1];
  if (iVar67 == 1 && iVar25 == 1) {
    iVar31 = ratio->vect[2];
    result.smallend.vect._0_8_ = lVar32;
    if (iVar31 == 1) goto LAB_0046590f;
  }
  else {
    result.smallend.vect[0] = (int)lVar32;
    if (iVar25 != 1) {
      if (iVar25 == 4) {
        if (result.smallend.vect[0] < 0) {
          result.smallend.vect[0] = result.smallend.vect[0] >> 2;
        }
        else {
          result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 2;
        }
      }
      else if (iVar25 == 2) {
        if (result.smallend.vect[0] < 0) {
          result.smallend.vect[0] = result.smallend.vect[0] >> 1;
        }
        else {
          result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 1;
        }
      }
      else if (result.smallend.vect[0] < 0) {
        result.smallend.vect[0] = ~(~result.smallend.vect[0] / iVar25);
      }
      else {
        result.smallend.vect[0] = result.smallend.vect[0] / iVar25;
      }
    }
    if (iVar67 != 1) {
      if (iVar67 == 4) {
        if (lVar32 < 0) {
          uVar23 = result.smallend.vect[1] >> 2;
        }
        else {
          uVar23 = (uint)result.smallend.vect[1] >> 2;
        }
      }
      else if (iVar67 == 2) {
        if (lVar32 < 0) {
          uVar23 = result.smallend.vect[1] >> 1;
        }
        else {
          uVar23 = (uint)result.smallend.vect[1] >> 1;
        }
      }
      else if (lVar32 < 0) {
        uVar23 = ~(~result.smallend.vect[1] / iVar67);
      }
      else {
        uVar23 = result.smallend.vect[1] / iVar67;
      }
    }
    iVar31 = ratio->vect[2];
  }
  result.smallend.vect[1] = uVar23;
  if (iVar31 != 1) {
    if (iVar31 == 4) {
      if (result.smallend.vect[2] < 0) {
        result.smallend.vect[2] = result.smallend.vect[2] >> 2;
      }
      else {
        result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 2;
      }
    }
    else if (iVar31 == 2) {
      if (result.smallend.vect[2] < 0) {
        result.smallend.vect[2] = result.smallend.vect[2] >> 1;
      }
      else {
        result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 1;
      }
    }
    else if (result.smallend.vect[2] < 0) {
      result.smallend.vect[2] = ~(~result.smallend.vect[2] / iVar31);
    }
    else {
      result.smallend.vect[2] = result.smallend.vect[2] / iVar31;
    }
  }
  result.btype.itype = SUB84(uVar16,4);
  result.bigend.vect[2] = (int)uVar16;
  if (result.btype.itype == 0) {
    uVar23 = result.bigend.vect[0];
    if (iVar25 != 1) {
      if (iVar25 == 4) {
        uVar23 = result.bigend.vect[0] >> 2;
        if (-1 < lVar26) {
          uVar23 = (uint)result.bigend.vect[0] >> 2;
        }
      }
      else if (iVar25 == 2) {
        uVar23 = result.bigend.vect[0] >> 1;
        if (-1 < lVar26) {
          uVar23 = (uint)result.bigend.vect[0] >> 1;
        }
      }
      else if (lVar26 < 0) {
        uVar23 = ~(~result.bigend.vect[0] / iVar25);
      }
      else {
        uVar23 = result.bigend.vect[0] / iVar25;
      }
    }
    uVar36 = result.bigend.vect[1];
    if (iVar67 != 1) {
      if (iVar67 == 4) {
        uVar36 = result.bigend.vect[1] >> 2;
        if (-1 < lVar72) {
          uVar36 = (uint)result.bigend.vect[1] >> 2;
        }
      }
      else if (iVar67 == 2) {
        uVar36 = result.bigend.vect[1] >> 1;
        if (-1 < lVar72) {
          uVar36 = (uint)result.bigend.vect[1] >> 1;
        }
      }
      else if (lVar72 < 0) {
        uVar36 = ~(~result.bigend.vect[1] / iVar67);
      }
      else {
        uVar36 = result.bigend.vect[1] / iVar67;
      }
    }
    uVar24 = result.bigend.vect[2];
    result.bigend.vect[0] = uVar23;
    result.bigend.vect[1] = uVar36;
    if (iVar31 != 1) {
      if (iVar31 == 4) {
        uVar24 = result.bigend.vect[2] >> 2;
        if (-1 < result.bigend.vect[2]) {
          uVar24 = (uint)result.bigend.vect[2] >> 2;
        }
      }
      else if (iVar31 == 2) {
        uVar24 = result.bigend.vect[2] >> 1;
        if (-1 < result.bigend.vect[2]) {
          uVar24 = (uint)result.bigend.vect[2] >> 1;
        }
      }
      else if (result.bigend.vect[2] < 0) {
        uVar24 = ~(~result.bigend.vect[2] / iVar31);
      }
      else {
        uVar24 = result.bigend.vect[2] / iVar31;
      }
    }
  }
  else {
    crsearr.arr[0].p = (double *)0x0;
    crsearr.arr[0].jstride._0_4_ = 0;
    for (lVar32 = 0; lVar32 != 3; lVar32 = lVar32 + 1) {
      if (((result.btype.itype >> ((uint)lVar32 & 0x1f) & 1) != 0) &&
         (result.bigend.vect[lVar32] % ratio->vect[lVar32] != 0)) {
        *(undefined4 *)((long)&crsearr.arr[0].p + lVar32 * 4) = 1;
      }
    }
    uVar23 = result.bigend.vect[0];
    if (iVar25 != 1) {
      if (iVar25 == 4) {
        uVar23 = result.bigend.vect[0] >> 2;
        if (-1 < lVar26) {
          uVar23 = (uint)result.bigend.vect[0] >> 2;
        }
      }
      else if (iVar25 == 2) {
        uVar23 = result.bigend.vect[0] >> 1;
        if (-1 < lVar26) {
          uVar23 = (uint)result.bigend.vect[0] >> 1;
        }
      }
      else if (lVar26 < 0) {
        uVar23 = ~(~result.bigend.vect[0] / iVar25);
      }
      else {
        uVar23 = result.bigend.vect[0] / iVar25;
      }
    }
    uVar36 = result.bigend.vect[1];
    if (iVar67 != 1) {
      if (iVar67 == 4) {
        uVar36 = result.bigend.vect[1] >> 2;
        if (-1 < lVar72) {
          uVar36 = (uint)result.bigend.vect[1] >> 2;
        }
      }
      else if (iVar67 == 2) {
        uVar36 = result.bigend.vect[1] >> 1;
        if (-1 < lVar72) {
          uVar36 = (uint)result.bigend.vect[1] >> 1;
        }
      }
      else if (lVar72 < 0) {
        uVar36 = ~(~result.bigend.vect[1] / iVar67);
      }
      else {
        uVar36 = result.bigend.vect[1] / iVar67;
      }
    }
    uVar24 = result.bigend.vect[2];
    if (iVar31 != 1) {
      if (iVar31 == 4) {
        uVar24 = result.bigend.vect[2] >> 2;
        if (-1 < result.bigend.vect[2]) {
          uVar24 = (uint)result.bigend.vect[2] >> 2;
        }
      }
      else if (iVar31 == 2) {
        uVar24 = result.bigend.vect[2] >> 1;
        if (-1 < result.bigend.vect[2]) {
          uVar24 = (uint)result.bigend.vect[2] >> 1;
        }
      }
      else if (result.bigend.vect[2] < 0) {
        uVar24 = ~(~result.bigend.vect[2] / iVar31);
      }
      else {
        uVar24 = result.bigend.vect[2] / iVar31;
      }
    }
    uVar24 = uVar24 + (int)crsearr.arr[0].jstride;
    result.bigend.vect[0] = uVar23 + (int)crsearr.arr[0].p;
    result.bigend.vect[1] = uVar36 + crsearr.arr[0].p._4_4_;
  }
  result.bigend.vect[2] = uVar24;
LAB_0046590f:
  dVar91 = (fine_geom->super_CoordSys).dx[0];
  dVar96 = (fine_geom->super_CoordSys).dx[1];
  dVar103 = (fine_geom->super_CoordSys).dx[2];
  GpuArray<amrex::Array4<const_double>,_3U>::GpuArray(&crsearr);
  GpuArray<amrex::Array4<double>,_3U>::GpuArray(&finearr);
  GpuArray<amrex::Array4<const_int>,_3U>::GpuArray(&maskarr);
  lVar72 = (long)crse_comp;
  lVar32 = (long)fine_comp;
  for (lVar26 = 0; lVar26 != 0x18; lVar26 = lVar26 + 8) {
    lVar34 = *(long *)((long)crse->_M_elems + lVar26);
    iVar25 = *(int *)(lVar34 + 0x20);
    uVar16 = *(undefined8 *)(lVar34 + 0x18);
    lVar48 = (long)*(int *)(lVar34 + 0x28) + 1;
    iVar67 = *(int *)(lVar34 + 0x24);
    lVar55 = (long)*(int *)(lVar34 + 0x2c) + 1;
    lVar65 = ((long)iVar67 - (long)*(int *)(lVar34 + 0x18)) + 1;
    lVar49 = (lVar48 - *(int *)(lVar34 + 0x1c)) * lVar65;
    lVar52 = (lVar55 - iVar25) * lVar49;
    iVar31 = *(int *)(lVar34 + 0x34);
    (&crsearr.arr[0].p)[lVar26] = (double *)(lVar52 * lVar72 * 8 + *(long *)(lVar34 + 0x10));
    (&crsearr.arr[0].jstride)[lVar26] = lVar65;
    (&crsearr.arr[0].kstride)[lVar26] = lVar49;
    (&crsearr.arr[0].nstride)[lVar26] = lVar52;
    *(undefined8 *)(&crsearr.arr[0].begin.x + lVar26 * 2) = uVar16;
    (&crsearr.arr[0].begin.z)[lVar26 * 2] = iVar25;
    *(ulong *)(&crsearr.arr[0].end.x + lVar26 * 2) = (ulong)(iVar67 + 1) | lVar48 << 0x20;
    (&crsearr.arr[0].end.z)[lVar26 * 2] = (int)lVar55;
    (&crsearr.arr[0].ncomp)[lVar26 * 2] = iVar31 - crse_comp;
    lVar34 = *(long *)((long)fine->_M_elems + lVar26);
    iVar25 = *(int *)(lVar34 + 0x20);
    uVar16 = *(undefined8 *)(lVar34 + 0x18);
    lVar48 = (long)*(int *)(lVar34 + 0x28) + 1;
    iVar67 = *(int *)(lVar34 + 0x24);
    lVar55 = (long)*(int *)(lVar34 + 0x2c) + 1;
    lVar65 = ((long)iVar67 - (long)*(int *)(lVar34 + 0x18)) + 1;
    lVar49 = (lVar48 - *(int *)(lVar34 + 0x1c)) * lVar65;
    lVar52 = (lVar55 - iVar25) * lVar49;
    iVar31 = *(int *)(lVar34 + 0x34);
    (&finearr.arr[0].p)[lVar26] = (double *)(lVar52 * lVar32 * 8 + *(long *)(lVar34 + 0x10));
    (&finearr.arr[0].jstride)[lVar26] = lVar65;
    (&finearr.arr[0].kstride)[lVar26] = lVar49;
    (&finearr.arr[0].nstride)[lVar26] = lVar52;
    *(undefined8 *)(&finearr.arr[0].begin.x + lVar26 * 2) = uVar16;
    (&finearr.arr[0].begin.z)[lVar26 * 2] = iVar25;
    *(ulong *)(&finearr.arr[0].end.x + lVar26 * 2) = (ulong)(iVar67 + 1) | lVar48 << 0x20;
    (&finearr.arr[0].end.z)[lVar26 * 2] = (int)lVar55;
    (&finearr.arr[0].ncomp)[lVar26 * 2] = iVar31 - fine_comp;
    lVar34 = *(long *)((long)solve_mask->_M_elems + lVar26);
    if (lVar34 != 0) {
      iVar25 = *(int *)(lVar34 + 0x34);
      iVar67 = *(int *)(lVar34 + 0x20);
      uVar16 = *(undefined8 *)(lVar34 + 0x18);
      lVar49 = (long)*(int *)(lVar34 + 0x28) + 1;
      iVar31 = *(int *)(lVar34 + 0x24);
      lVar48 = (long)*(int *)(lVar34 + 0x2c) + 1;
      lVar55 = ((long)iVar31 - (long)*(int *)(lVar34 + 0x18)) + 1;
      lVar52 = (lVar49 - *(int *)(lVar34 + 0x1c)) * lVar55;
      (&maskarr.arr[0].p)[lVar26] = *(int **)(lVar34 + 0x10);
      (&maskarr.arr[0].jstride)[lVar26] = lVar55;
      (&maskarr.arr[0].kstride)[lVar26] = lVar52;
      (&maskarr.arr[0].nstride)[lVar26] = (lVar48 - iVar67) * lVar52;
      *(undefined8 *)(&maskarr.arr[0].begin.x + lVar26 * 2) = uVar16;
      (&maskarr.arr[0].begin.z)[lVar26 * 2] = iVar67;
      *(ulong *)(&maskarr.arr[0].end.x + lVar26 * 2) =
           (long)iVar31 + 1U & 0xffffffff | lVar49 << 0x20;
      (&maskarr.arr[0].end.z)[lVar26 * 2] = (int)lVar48;
      (&maskarr.arr[0].ncomp)[lVar26 * 2] = iVar25;
    }
  }
  bx.bigend.vect[1] = result.bigend.vect[1];
  bx.bigend.vect[2] = result.bigend.vect[2];
  bx.btype.itype = result.btype.itype;
  bx.bigend.vect[0] = result.bigend.vect[0];
  for (lVar26 = 0; uVar23 = (uint)lVar26, lVar26 != 3; lVar26 = lVar26 + 1) {
    uVar36 = 1 << ((byte)lVar26 & 0x1f);
    bx.bigend.vect[lVar26] =
         (bx.bigend.vect[lVar26] + (uint)((types._M_elems[0].itype >> (uVar23 & 0x1f) & 1) != 0)) -
         (uint)((bx.btype.itype >> (uVar23 & 0x1f) & 1) != 0);
    if ((types._M_elems[0].itype >> (uVar23 & 0x1f) & 1) == 0) {
      IVar37.itype = ~uVar36 & bx.btype.itype;
    }
    else {
      IVar37.itype = uVar36 | bx.btype.itype;
    }
    bx.btype.itype = IVar37.itype;
  }
  bx_1.bigend.vect[1] = result.bigend.vect[1];
  bx_1.bigend.vect[2] = result.bigend.vect[2];
  bx_1.btype.itype = result.btype.itype;
  bx_1.bigend.vect[0] = result.bigend.vect[0];
  for (lVar26 = 0; uVar23 = (uint)lVar26, lVar26 != 3; lVar26 = lVar26 + 1) {
    uVar36 = 1 << ((byte)lVar26 & 0x1f);
    bx_1.bigend.vect[lVar26] =
         (bx_1.bigend.vect[lVar26] + (uint)((types._M_elems[1].itype >> (uVar23 & 0x1f) & 1) != 0))
         - (uint)((bx_1.btype.itype >> (uVar23 & 0x1f) & 1) != 0);
    if ((types._M_elems[1].itype >> (uVar23 & 0x1f) & 1) == 0) {
      IVar37.itype = ~uVar36 & bx_1.btype.itype;
    }
    else {
      IVar37.itype = uVar36 | bx_1.btype.itype;
    }
    bx_1.btype.itype = IVar37.itype;
  }
  bx_2.bigend.vect[1] = result.bigend.vect[1];
  bx_2.bigend.vect[2] = result.bigend.vect[2];
  bx_2.btype.itype = result.btype.itype;
  bx_2.bigend.vect[0] = result.bigend.vect[0];
  for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
    uVar36 = 1 << ((byte)lVar26 & 0x1f);
    uVar23 = (uint)lVar26;
    bx_2.bigend.vect[lVar26] =
         (bx_2.bigend.vect[lVar26] + (uint)((types._M_elems[2].itype >> (uVar23 & 0x1f) & 1) != 0))
         - (uint)((bx_2.btype.itype >> (uVar23 & 0x1f) & 1) != 0);
    if ((types._M_elems[2].itype >> (uVar23 & 0x1f) & 1) == 0) {
      IVar37.itype = ~uVar36 & bx_2.btype.itype;
    }
    else {
      IVar37.itype = uVar36 | bx_2.btype.itype;
    }
    bx_2.btype.itype = IVar37.itype;
  }
  bx.smallend.vect[0] = result.smallend.vect[0];
  uVar38 = (ulong)bx.smallend.vect[0];
  bx.smallend.vect[1] = result.smallend.vect[1];
  uVar23 = 0;
  if (0 < ncomp) {
    uVar23 = ncomp;
  }
  uVar27 = (ulong)uVar23;
  lVar26 = lVar72 * 4;
  lVar72 = lVar72 * 8;
  iVar25 = result.smallend.vect[2] + -1;
  lVar34 = lVar32 * 8;
  lVar48 = (long)result.smallend.vect[2];
  local_5e8 = result.smallend.vect[2];
  while( true ) {
    local_5e8 = local_5e8 + 1;
    if (bx.bigend.vect[2] < (int)lVar48) break;
    lVar49 = (long)bx.smallend.vect[1];
    iVar67 = bx.smallend.vect[1] + -1;
    iVar31 = bx.smallend.vect[1];
    while( true ) {
      iVar31 = iVar31 + 1;
      if (bx.bigend.vect[1] < (int)lVar49) break;
      uVar40 = uVar38;
      lVar52 = uVar38 * 4;
      lVar55 = uVar38 << 3;
      while (iVar47 = (int)uVar40, iVar47 <= bx.bigend.vect[0]) {
        lVar56 = lVar72 * crsearr.arr[0].nstride + lVar55;
        lVar53 = crsearr.arr[0].kstride * 8;
        lVar44 = (local_5e8 - crsearr.arr[0].begin.z) * lVar53;
        lVar65 = lVar56 + lVar44;
        lVar50 = CONCAT44(crsearr.arr[0].jstride._4_4_,(int)crsearr.arr[0].jstride) * 8;
        lVar28 = (iVar31 - crsearr.arr[0].begin.y) * lVar50;
        lVar33 = (lVar48 - crsearr.arr[0].begin.z) * lVar53 + lVar56;
        lVar53 = (iVar25 - crsearr.arr[0].begin.z) * lVar53;
        lVar39 = lVar56 + lVar53;
        lVar62 = (lVar49 - crsearr.arr[0].begin.y) * lVar50;
        lVar56 = lVar56 + lVar62;
        lVar63 = (long)crsearr.arr[0].p + lVar33 + lVar62;
        lVar50 = (iVar67 - crsearr.arr[0].begin.y) * lVar50;
        lVar62 = (long)crsearr.arr[0].p + lVar65 + lVar28;
        local_6b8 = lVar28 + lVar33 + (long)crsearr.arr[0].p;
        local_718 = (long)crsearr.arr[0].p + lVar39 + lVar28;
        local_6f8 = lVar44 + lVar56 + (long)crsearr.arr[0].p;
        local_618 = lVar56 + lVar53 + (long)crsearr.arr[0].p;
        local_678 = (long)crsearr.arr[0].p + lVar65 + lVar50;
        lVar73 = lVar50 + lVar33 + (long)crsearr.arr[0].p;
        lVar44 = (long)crsearr.arr[0].p + lVar39 + lVar50;
        iVar46 = ratio->vect[2] * (int)lVar48;
        lVar53 = (long)((iVar46 - finearr.arr[0].begin.z) + 1) * finearr.arr[0].kstride * 8 +
                 lVar34 * finearr.arr[0].nstride;
        lVar39 = ((long)iVar46 - (long)finearr.arr[0].begin.z) * finearr.arr[0].kstride * 8 +
                 lVar34 * finearr.arr[0].nstride;
        iVar46 = ratio->vect[1] * (int)lVar49;
        lVar65 = (long)((iVar46 - finearr.arr[0].begin.y) + 1) * finearr.arr[0].jstride * 8;
        lVar50 = ((long)iVar46 - (long)finearr.arr[0].begin.y) * finearr.arr[0].jstride * 8;
        lVar28 = (long)finearr.arr[0].begin.x;
        lVar33 = lVar53 + lVar65 + lVar28 * -8 + (long)finearr.arr[0].p;
        lVar65 = lVar65 + lVar39 + lVar28 * -8 + (long)finearr.arr[0].p;
        lVar70 = lVar53 + lVar50 + lVar28 * -8 + (long)finearr.arr[0].p;
        lVar50 = lVar50 + lVar39 + lVar28 * -8 + (long)finearr.arr[0].p;
        piVar66 = (int *)(lVar26 * maskarr.arr[0].nstride +
                          lVar52 + (lVar48 - maskarr.arr[0].begin.z) * maskarr.arr[0].kstride * 4 +
                          (lVar49 - maskarr.arr[0].begin.y) * maskarr.arr[0].jstride * 4 +
                          (long)maskarr.arr[0].begin.x * -4 + (long)maskarr.arr[0].p);
        lVar53 = (long)crsearr.arr[0].begin.x * -8;
        lVar56 = crsearr.arr[0].nstride * 8;
        lVar28 = (long)(ratio->vect[0] * iVar47);
        lVar39 = finearr.arr[0].nstride * 8;
        uVar40 = uVar27;
        while (bVar79 = uVar40 != 0, uVar40 = uVar40 - 1, bVar79) {
          if ((maskarr.arr[0].p == (int *)0x0) || (*piVar66 != 0)) {
            dVar87 = *(double *)(lVar44 + lVar53);
            dVar99 = *(double *)(lVar73 + lVar53);
            dVar80 = *(double *)(local_678 + lVar53);
            dVar85 = *(double *)(local_618 + lVar53);
            dVar86 = *(double *)(local_6f8 + lVar53);
            dVar90 = *(double *)(local_718 + lVar53);
            dVar94 = *(double *)(local_6b8 + lVar53);
            dVar93 = *(double *)(lVar62 + lVar53);
            dVar95 = *(double *)(lVar63 + lVar53) * 64.0;
            dVar97 = ((dVar87 + dVar93) - dVar90) - dVar80;
            *(double *)(lVar50 + lVar28 * 8) =
                 ((((dVar99 + dVar85) - dVar94) - dVar86) * 8.0 + dVar95 + dVar97) * 0.015625;
            dVar93 = ((dVar80 + dVar90) - dVar87) - dVar93;
            *(double *)(lVar70 + lVar28 * 8) =
                 ((((dVar99 + dVar86) - dVar94) - dVar85) * 8.0 + dVar95 + dVar93) * 0.015625;
            *(double *)(lVar65 + lVar28 * 8) =
                 ((((dVar85 + dVar94) - dVar99) - dVar86) * 8.0 + dVar95 + dVar93) * 0.015625;
            *(double *)(lVar33 + lVar28 * 8) =
                 ((((dVar86 + dVar94) - dVar99) - dVar85) * 8.0 + dVar95 + dVar97) * 0.015625;
          }
          piVar66 = piVar66 + maskarr.arr[0].nstride;
          lVar62 = lVar62 + lVar56;
          local_6b8 = local_6b8 + lVar56;
          local_718 = local_718 + lVar56;
          local_6f8 = local_6f8 + lVar56;
          lVar63 = lVar63 + lVar56;
          local_618 = local_618 + lVar56;
          local_678 = local_678 + lVar56;
          lVar73 = lVar73 + lVar56;
          lVar44 = lVar44 + lVar56;
          lVar33 = lVar33 + lVar39;
          lVar65 = lVar65 + lVar39;
          lVar70 = lVar70 + lVar39;
          lVar50 = lVar50 + lVar39;
        }
        lVar52 = lVar52 + 4;
        lVar55 = lVar55 + 8;
        uVar40 = (ulong)(iVar47 + 1);
      }
      iVar67 = iVar67 + 1;
      lVar49 = lVar49 + 1;
    }
    iVar25 = iVar25 + 1;
    lVar48 = lVar48 + 1;
  }
  uVar38 = (ulong)bx.smallend.vect[0];
  iVar25 = result.smallend.vect[2] + -1;
  lVar48 = (long)result.smallend.vect[2];
  local_5e8 = result.smallend.vect[2];
  while( true ) {
    local_5e8 = local_5e8 + 1;
    if (bx_1.bigend.vect[2] < (int)lVar48) break;
    for (lVar49 = (long)bx.smallend.vect[1]; uVar40 = uVar38, lVar52 = uVar38 * 4,
        lVar55 = uVar38 << 3, iVar31 = bx.smallend.vect[0] + -1, iVar67 = bx.smallend.vect[0],
        (int)lVar49 <= bx_1.bigend.vect[1]; lVar49 = lVar49 + 1) {
      while( true ) {
        iVar67 = iVar67 + 1;
        iVar47 = (int)uVar40;
        if (bx_1.bigend.vect[0] < iVar47) break;
        lVar33 = (long)crsearr.arr[1].begin.x;
        lVar28 = (lVar49 - crsearr.arr[1].begin.y) * crsearr.arr[1].jstride;
        lVar44 = crsearr.arr[1].kstride * 8;
        lVar53 = (local_5e8 - crsearr.arr[1].begin.z) * lVar44;
        lVar65 = lVar53 + lVar28 * 8;
        lVar70 = (long)(iVar67 - crsearr.arr[1].begin.x);
        lVar39 = lVar55 + lVar28 * 8;
        lVar50 = (lVar48 - crsearr.arr[1].begin.z) * lVar44;
        lVar44 = (iVar25 - crsearr.arr[1].begin.z) * lVar44;
        lVar62 = lVar50 + lVar28 * 8;
        lVar28 = lVar44 + lVar28 * 8;
        lVar74 = (long)(iVar31 - crsearr.arr[1].begin.x);
        lVar73 = lVar65 + lVar70 * 8 + (long)crsearr.arr[1].p;
        lVar56 = lVar53 + lVar39 + lVar33 * -8 + (long)crsearr.arr[1].p;
        lVar53 = lVar65 + lVar74 * 8 + (long)crsearr.arr[1].p;
        lVar63 = lVar62 + lVar70 * 8 + (long)crsearr.arr[1].p;
        lVar50 = lVar50 + lVar39 + lVar33 * -8 + (long)crsearr.arr[1].p;
        lVar62 = lVar62 + lVar74 * 8 + (long)crsearr.arr[1].p;
        lVar65 = lVar28 + lVar70 * 8 + (long)crsearr.arr[1].p;
        lVar33 = lVar44 + lVar39 + lVar33 * -8 + (long)crsearr.arr[1].p;
        lVar28 = lVar28 + lVar74 * 8 + (long)crsearr.arr[1].p;
        iVar46 = ratio->vect[2] * (int)lVar48;
        lVar39 = (long)((iVar46 - finearr.arr[1].begin.z) + 1) * finearr.arr[1].kstride * 8;
        lVar75 = ((long)iVar46 - (long)finearr.arr[1].begin.z) * finearr.arr[1].kstride * 8;
        iVar46 = iVar47 * ratio->vect[0];
        lVar44 = (long)((iVar46 - finearr.arr[1].begin.x) + 1);
        piVar66 = (int *)(lVar26 * maskarr.arr[1].nstride +
                          lVar52 + (lVar48 - maskarr.arr[1].begin.z) * maskarr.arr[1].kstride * 4 +
                          (lVar49 - maskarr.arr[1].begin.y) * maskarr.arr[1].jstride * 4 +
                          (long)maskarr.arr[1].begin.x * -4 + (long)maskarr.arr[1].p);
        lVar76 = lVar72 * crsearr.arr[1].nstride;
        lVar70 = crsearr.arr[1].nstride * 8;
        lVar74 = lVar34 * finearr.arr[1].nstride +
                 ((long)(ratio->vect[1] * (int)lVar49) - (long)finearr.arr[1].begin.y) *
                 finearr.arr[1].jstride * 8 + (long)finearr.arr[1].p;
        uVar40 = uVar27;
        while (bVar79 = uVar40 != 0, uVar40 = uVar40 - 1, bVar79) {
          if ((maskarr.arr[1].p == (int *)0x0) || (*piVar66 != 0)) {
            dVar87 = *(double *)(lVar28 + lVar76);
            dVar99 = *(double *)(lVar33 + lVar76);
            dVar80 = *(double *)(lVar65 + lVar76);
            dVar85 = *(double *)(lVar62 + lVar76);
            dVar86 = *(double *)(lVar63 + lVar76);
            dVar90 = *(double *)(lVar53 + lVar76);
            dVar94 = *(double *)(lVar56 + lVar76);
            dVar93 = *(double *)(lVar73 + lVar76);
            dVar95 = *(double *)(lVar50 + lVar76) * 64.0;
            dVar97 = ((dVar87 + dVar93) - dVar90) - dVar80;
            *(double *)(lVar74 + lVar75 + (long)iVar46 * 8 + (long)finearr.arr[1].begin.x * -8) =
                 ((((dVar99 + dVar85) - dVar94) - dVar86) * 8.0 + dVar95 + dVar97) * 0.015625;
            dVar93 = ((dVar80 + dVar90) - dVar87) - dVar93;
            *(double *)(lVar74 + lVar75 + lVar44 * 8) =
                 ((((dVar99 + dVar86) - dVar94) - dVar85) * 8.0 + dVar95 + dVar93) * 0.015625;
            *(double *)(lVar74 + lVar39 + (long)iVar46 * 8 + (long)finearr.arr[1].begin.x * -8) =
                 ((((dVar85 + dVar94) - dVar99) - dVar86) * 8.0 + dVar95 + dVar93) * 0.015625;
            *(double *)(lVar74 + lVar39 + lVar44 * 8) =
                 ((((dVar86 + dVar94) - dVar99) - dVar85) * 8.0 + dVar95 + dVar97) * 0.015625;
          }
          piVar66 = piVar66 + maskarr.arr[1].nstride;
          lVar73 = lVar73 + lVar70;
          lVar56 = lVar56 + lVar70;
          lVar53 = lVar53 + lVar70;
          lVar63 = lVar63 + lVar70;
          lVar50 = lVar50 + lVar70;
          lVar62 = lVar62 + lVar70;
          lVar65 = lVar65 + lVar70;
          lVar33 = lVar33 + lVar70;
          lVar28 = lVar28 + lVar70;
          lVar74 = lVar74 + finearr.arr[1].nstride * 8;
        }
        lVar52 = lVar52 + 4;
        lVar55 = lVar55 + 8;
        iVar31 = iVar31 + 1;
        uVar40 = (ulong)(iVar47 + 1);
      }
    }
    iVar25 = iVar25 + 1;
    lVar48 = lVar48 + 1;
  }
  uVar38 = (ulong)bx.smallend.vect[0];
  for (lVar48 = (long)result.smallend.vect[2]; lVar49 = (long)bx.smallend.vect[1],
      iVar25 = bx.smallend.vect[1] + -1, local_5e8 = bx.smallend.vect[1],
      (int)lVar48 <= bx_2.bigend.vect[2]; lVar48 = lVar48 + 1) {
    while( true ) {
      local_5e8 = local_5e8 + 1;
      if (bx_2.bigend.vect[1] < (int)lVar49) break;
      uVar40 = uVar38;
      lVar52 = uVar38 * 4;
      lVar55 = uVar38 << 3;
      iVar31 = bx.smallend.vect[0] + -1;
      iVar67 = bx.smallend.vect[0];
      while( true ) {
        iVar67 = iVar67 + 1;
        iVar47 = (int)uVar40;
        if (bx_2.bigend.vect[0] < iVar47) break;
        lVar33 = (long)crsearr.arr[2].begin.x;
        lVar28 = (lVar48 - crsearr.arr[2].begin.z) * crsearr.arr[2].kstride;
        lVar50 = crsearr.arr[2].jstride * 8;
        lVar53 = (local_5e8 - crsearr.arr[2].begin.y) * lVar50;
        lVar65 = lVar53 + lVar28 * 8;
        lVar56 = (long)(iVar67 - crsearr.arr[2].begin.x);
        lVar39 = lVar55 + lVar28 * 8;
        lVar44 = (lVar49 - crsearr.arr[2].begin.y) * lVar50;
        lVar50 = (iVar25 - crsearr.arr[2].begin.y) * lVar50;
        lVar62 = lVar44 + lVar28 * 8;
        lVar28 = lVar50 + lVar28 * 8;
        lVar70 = (long)(iVar31 - crsearr.arr[2].begin.x);
        lVar74 = lVar65 + lVar56 * 8 + (long)crsearr.arr[2].p;
        lVar53 = lVar53 + lVar39 + lVar33 * -8 + (long)crsearr.arr[2].p;
        lVar63 = lVar65 + lVar70 * 8 + (long)crsearr.arr[2].p;
        lVar73 = lVar62 + lVar56 * 8 + (long)crsearr.arr[2].p;
        lVar44 = lVar44 + lVar39 + lVar33 * -8 + (long)crsearr.arr[2].p;
        lVar62 = lVar62 + lVar70 * 8 + (long)crsearr.arr[2].p;
        lVar56 = lVar28 + lVar56 * 8 + (long)crsearr.arr[2].p;
        lVar39 = lVar50 + lVar39 + lVar33 * -8 + (long)crsearr.arr[2].p;
        lVar65 = lVar28 + lVar70 * 8 + (long)crsearr.arr[2].p;
        iVar46 = ratio->vect[1] * (int)lVar49;
        lVar28 = (long)((iVar46 - finearr.arr[2].begin.y) + 1) * finearr.arr[2].jstride * 8;
        lVar33 = ((long)iVar46 - (long)finearr.arr[2].begin.y) * finearr.arr[2].jstride * 8;
        iVar46 = iVar47 * ratio->vect[0];
        lVar70 = (long)((iVar46 - finearr.arr[2].begin.x) + 1);
        piVar66 = (int *)(lVar26 * maskarr.arr[2].nstride +
                          lVar52 + (lVar48 - maskarr.arr[2].begin.z) * maskarr.arr[2].kstride * 4 +
                          (lVar49 - maskarr.arr[2].begin.y) * maskarr.arr[2].jstride * 4 +
                          (long)maskarr.arr[2].begin.x * -4 + (long)maskarr.arr[2].p);
        lVar76 = lVar72 * crsearr.arr[2].nstride;
        lVar50 = crsearr.arr[2].nstride * 8;
        lVar75 = lVar34 * finearr.arr[2].nstride +
                 ((long)(ratio->vect[2] * (int)lVar48) - (long)finearr.arr[2].begin.z) *
                 finearr.arr[2].kstride * 8 + (long)finearr.arr[2].p;
        uVar40 = uVar27;
        while (bVar79 = uVar40 != 0, uVar40 = uVar40 - 1, bVar79) {
          if ((maskarr.arr[2].p == (int *)0x0) || (*piVar66 != 0)) {
            dVar87 = *(double *)(lVar65 + lVar76);
            dVar99 = *(double *)(lVar39 + lVar76);
            dVar80 = *(double *)(lVar56 + lVar76);
            dVar85 = *(double *)(lVar62 + lVar76);
            dVar86 = *(double *)(lVar73 + lVar76);
            dVar90 = *(double *)(lVar63 + lVar76);
            dVar94 = *(double *)(lVar53 + lVar76);
            dVar93 = *(double *)(lVar74 + lVar76);
            dVar95 = *(double *)(lVar44 + lVar76) * 64.0;
            dVar97 = ((dVar87 + dVar93) - dVar90) - dVar80;
            *(double *)(lVar75 + lVar33 + (long)iVar46 * 8 + (long)finearr.arr[2].begin.x * -8) =
                 ((((dVar99 + dVar85) - dVar94) - dVar86) * 8.0 + dVar95 + dVar97) * 0.015625;
            dVar93 = ((dVar80 + dVar90) - dVar87) - dVar93;
            *(double *)(lVar75 + lVar33 + lVar70 * 8) =
                 ((((dVar99 + dVar86) - dVar94) - dVar85) * 8.0 + dVar95 + dVar93) * 0.015625;
            *(double *)(lVar75 + lVar28 + (long)iVar46 * 8 + (long)finearr.arr[2].begin.x * -8) =
                 ((((dVar85 + dVar94) - dVar99) - dVar86) * 8.0 + dVar95 + dVar93) * 0.015625;
            *(double *)(lVar75 + lVar28 + lVar70 * 8) =
                 ((((dVar86 + dVar94) - dVar99) - dVar85) * 8.0 + dVar95 + dVar97) * 0.015625;
          }
          piVar66 = piVar66 + maskarr.arr[2].nstride;
          lVar74 = lVar74 + lVar50;
          lVar53 = lVar53 + lVar50;
          lVar63 = lVar63 + lVar50;
          lVar73 = lVar73 + lVar50;
          lVar44 = lVar44 + lVar50;
          lVar62 = lVar62 + lVar50;
          lVar56 = lVar56 + lVar50;
          lVar39 = lVar39 + lVar50;
          lVar65 = lVar65 + lVar50;
          lVar75 = lVar75 + finearr.arr[2].nstride * 8;
        }
        lVar52 = lVar52 + 4;
        lVar55 = lVar55 + 8;
        iVar31 = iVar31 + 1;
        uVar40 = (ulong)(iVar47 + 1);
      }
      iVar25 = iVar25 + 1;
      lVar49 = lVar49 + 1;
    }
  }
  iVar25 = ratio->vect[1];
  lVar52 = (long)iVar25;
  lVar49 = bx.smallend.vect[1] * lVar52;
  lVar26 = lVar49 + 1;
  lVar55 = result.smallend.vect[2] * lVar52;
  lVar72 = lVar55 + 1;
  lVar62 = (lVar26 - finearr.arr[2].begin.y) * finearr.arr[2].jstride;
  lVar34 = finearr.arr[2].nstride * lVar32;
  lVar65 = (lVar49 - finearr.arr[2].begin.y) * finearr.arr[2].jstride;
  iVar67 = ratio->vect[0];
  lVar39 = (lVar72 - finearr.arr[2].begin.z) * finearr.arr[2].kstride;
  lVar50 = (long)bx.smallend.vect[0] * (long)iVar67;
  lVar28 = (long)finearr.arr[2].begin.x;
  lVar48 = (lVar55 - finearr.arr[2].begin.z) * finearr.arr[2].kstride;
  local_448 = finearr.arr[2].p + ((lVar39 + lVar50 + lVar62 + lVar34 + 1) - lVar28);
  local_418 = finearr.arr[2].p + ((lVar50 + lVar62 + lVar34) - lVar28);
  local_438 = finearr.arr[2].p + ((lVar48 + lVar50 + lVar62 + lVar34) - lVar28);
  local_450 = finearr.arr[2].p + ((lVar39 + lVar50 + lVar65 + lVar34 + 1) - lVar28);
  local_420 = finearr.arr[2].p + ((lVar50 + lVar65 + lVar34) - lVar28);
  local_440 = finearr.arr[2].p + ((lVar48 + lVar50 + lVar65 + lVar34) - lVar28);
  lVar34 = (long)finearr.arr[0].begin.y;
  lVar65 = (lVar26 - lVar34) * finearr.arr[0].jstride;
  lVar33 = (long)finearr.arr[0].begin.z;
  lVar39 = (lVar72 - lVar33) * finearr.arr[0].kstride;
  lVar28 = (lVar49 - lVar34) * finearr.arr[0].jstride;
  lVar56 = (lVar55 - lVar33) * finearr.arr[0].kstride;
  lVar63 = finearr.arr[0].nstride * lVar32;
  lVar62 = (long)finearr.arr[0].begin.x;
  lVar55 = (lVar55 - finearr.arr[1].begin.z) * finearr.arr[1].kstride;
  lVar44 = finearr.arr[1].nstride * lVar32;
  lVar48 = (lVar72 - finearr.arr[1].begin.z) * finearr.arr[1].kstride;
  lVar53 = (long)finearr.arr[1].begin.x;
  lVar72 = (lVar49 - finearr.arr[1].begin.y) * finearr.arr[1].jstride;
  lVar26 = (lVar26 - finearr.arr[1].begin.y) * finearr.arr[1].jstride;
  local_468 = finearr.arr[1].p + ((lVar50 + lVar55 + lVar44) - lVar53);
  local_478 = finearr.arr[1].p + ((lVar50 + lVar48 + lVar44 + lVar72 + 1) - lVar53);
  local_480 = finearr.arr[1].p + ((lVar72 + lVar50 + lVar55 + lVar44 + 1) - lVar53);
  local_470 = finearr.arr[1].p + ((lVar50 + lVar48 + lVar44 + lVar26) - lVar53);
  local_460 = finearr.arr[1].p + ((lVar26 + lVar50 + lVar55 + lVar44) - lVar53);
  local_458 = finearr.arr[1].p + ((lVar50 + lVar48 + lVar44) - lVar53);
  dVar93 = dVar91 * dVar91;
  dVar97 = dVar96 * dVar96;
  dVar99 = dVar103 * dVar103;
  dVar104 = (dVar103 + dVar103) * dVar103;
  dVar80 = dVar96 * 8.0 * (dVar99 + dVar93);
  dVar90 = dVar103 * 8.0 * (dVar93 + dVar97);
  dVar85 = (dVar96 + dVar96) * dVar96;
  dVar87 = dVar91 * 8.0 * (dVar97 + dVar99);
  dVar86 = (dVar91 + dVar91) * dVar91;
  dVar95 = ((dVar93 + dVar85) * dVar91) / dVar90;
  dVar98 = (dVar91 * dVar93) / dVar90;
  dVar105 = ((dVar104 + dVar97) * dVar96) / dVar87;
  dVar94 = (dVar96 * dVar97) / dVar87;
  dVar100 = ((dVar97 + dVar86) * dVar96) / dVar90;
  dVar90 = (dVar96 * dVar97) / dVar90;
  dVar85 = ((dVar85 + dVar99) * dVar103) / dVar87;
  dVar87 = (dVar103 * dVar99) / dVar87;
  dVar97 = ((dVar104 + dVar93) * dVar91) / dVar80;
  dVar96 = (dVar91 * dVar93) / dVar80;
  dVar91 = ((dVar86 + dVar99) * dVar103) / dVar80;
  dVar80 = (dVar103 * dVar99) / dVar80;
  auVar10._8_4_ = SUB84(dVar94,0);
  auVar10._0_8_ = dVar94;
  auVar10._12_4_ = (int)((ulong)dVar94 >> 0x20);
  lVar26 = finearr.arr[2].kstride * lVar52;
  lVar72 = finearr.arr[2].jstride * lVar52;
  local_488 = finearr.arr[0].p + ((lVar50 + lVar63 + lVar65 + lVar39 + 1) - lVar62);
  lVar48 = finearr.arr[0].kstride * lVar52;
  lVar49 = finearr.arr[0].jstride * lVar52;
  local_490 = finearr.arr[0].p + ((lVar50 + lVar63 + lVar65 + lVar56 + 1) - lVar62);
  local_498 = finearr.arr[0].p + ((lVar50 + lVar63 + lVar39 + lVar28 + 1) - lVar62);
  local_4a0 = finearr.arr[0].p + ((lVar50 + lVar63 + lVar28 + lVar56 + 1) - lVar62);
  lVar65 = finearr.arr[1].kstride * lVar52;
  lVar55 = finearr.arr[1].jstride * lVar52;
  for (uVar38 = 0; uVar38 != uVar27; uVar38 = uVar38 + 1) {
    lVar62 = (uVar38 + lVar32) * finearr.arr[0].nstride;
    local_3e8 = local_458;
    local_3f0 = local_468;
    local_408 = local_438;
    local_410 = local_448;
    pdVar35 = local_460;
    pdVar41 = local_470;
    pdVar43 = local_440;
    pdVar45 = local_450;
    pdVar51 = local_480;
    pdVar54 = local_478;
    pdVar57 = local_4a0;
    pdVar59 = local_498;
    pdVar60 = local_490;
    pdVar77 = local_488;
    local_640 = (result.smallend.vect[2] * iVar25 - finearr.arr[2].begin.z) + 2;
    for (lVar39 = (long)result.smallend.vect[2]; lVar39 <= result.bigend.vect[2];
        lVar39 = lVar39 + 1) {
      lVar28 = (long)local_640 * finearr.arr[2].kstride * 8;
      pdVar29 = (double *)((long)local_418 + lVar28);
      pdVar68 = (double *)(lVar28 + (long)local_420);
      lVar28 = lVar39 * lVar52 - lVar33;
      lVar50 = finearr.arr[0].kstride * lVar28;
      lVar44 = (lVar28 + 1) * finearr.arr[0].kstride;
      local_6a8 = local_408;
      local_3d8 = local_410;
      pdVar30 = pdVar59;
      pdVar42 = pdVar41;
      pdVar58 = pdVar54;
      pdVar61 = pdVar60;
      pdVar64 = pdVar35;
      pdVar69 = pdVar57;
      pdVar71 = pdVar51;
      pdVar78 = pdVar77;
      local_6a0 = pdVar43;
      local_63c = (bx.smallend.vect[1] * iVar25 - finearr.arr[1].begin.y) + 2;
      local_3e0 = pdVar45;
      for (lVar28 = (long)bx.smallend.vect[1]; lVar28 <= result.bigend.vect[1]; lVar28 = lVar28 + 1)
      {
        if (bx.smallend.vect[0] <= result.bigend.vect[0]) {
          lVar53 = (long)local_63c * finearr.arr[1].jstride * 8;
          lVar56 = lVar28 * lVar52 - lVar34;
          lVar63 = lVar56 * finearr.arr[0].jstride;
          lVar56 = (lVar56 + 1) * finearr.arr[0].jstride;
          lVar70 = 0;
          iVar31 = (bx.smallend.vect[0] * iVar67 - finearr.arr[0].begin.x) + 2;
          iVar47 = (result.bigend.vect[0] - bx.smallend.vect[0]) + 1;
          do {
            lVar73 = (long)iVar31;
            dVar103 = finearr.arr[0].p[lVar63 + lVar73 + lVar50 + lVar62];
            dVar99 = finearr.arr[0].p[lVar56 + lVar73 + lVar50 + lVar62];
            dVar86 = *(double *)((long)pdVar69 + lVar70 + -8);
            dVar93 = *(double *)((long)pdVar61 + lVar70 + -8);
            dVar104 = *(double *)((long)pdVar71 + lVar70 + -8);
            dVar1 = *(double *)((long)pdVar71 + lVar70);
            dVar89 = *(double *)((long)local_3f0 + lVar70 + lVar53);
            dVar106 = *(double *)((long)local_3f0 + lVar70 + lVar53 + 8);
            dVar2 = *(double *)((long)pdVar58 + lVar70 + -8);
            dVar3 = *(double *)((long)pdVar58 + lVar70);
            dVar4 = *(double *)((long)local_3e8 + lVar70 + lVar53);
            dVar5 = *(double *)((long)local_3e8 + lVar70 + lVar53 + 8);
            dVar101 = ((dVar104 + dVar106) - dVar89) - dVar1;
            dVar13 = dVar97 * dVar101;
            auVar11._8_4_ = SUB84(dVar2,0);
            auVar11._0_8_ = dVar104;
            auVar11._12_4_ = (int)((ulong)dVar2 >> 0x20);
            dVar83 = ((dVar2 + dVar5) - dVar4) - dVar3;
            dVar14 = dVar96 * dVar83;
            dVar6 = finearr.arr[0].p[lVar56 + lVar73 + lVar44 + lVar62];
            dVar7 = *(double *)((long)pdVar30 + lVar70 + -8);
            dVar8 = *(double *)((long)pdVar78 + lVar70 + -8);
            dVar9 = finearr.arr[0].p[lVar63 + lVar73 + lVar44 + lVar62];
            dVar83 = dVar83 * dVar97;
            dVar101 = dVar101 * dVar96;
            dVar92 = ((dVar7 + dVar6) - dVar8) - dVar9;
            dVar81 = SUB168(*(undefined1 (*) [16])((long)pdVar68 + lVar70),0);
            dVar84 = SUB168(*(undefined1 (*) [16])((long)pdVar68 + lVar70),8);
            dVar17 = *(double *)((long)local_6a0 + lVar70);
            dVar18 = ((double *)((long)local_6a0 + lVar70))[1];
            dVar15 = ((dVar17 + dVar84) - dVar81) - dVar18;
            dVar82 = dVar95 * dVar15;
            dVar19 = *(double *)((long)pdVar29 + lVar70);
            dVar20 = ((double *)((long)pdVar29 + lVar70))[1];
            dVar21 = *(double *)((long)local_6a8 + lVar70);
            dVar22 = ((double *)((long)local_6a8 + lVar70))[1];
            dVar102 = ((dVar21 + dVar20) - dVar19) - dVar22;
            dVar88 = dVar98 * dVar102;
            *(double *)((long)pdVar69 + lVar70) =
                 (dVar86 + dVar103) * 0.5 + dVar13 + dVar14 + dVar82 + dVar88;
            dVar102 = dVar102 * dVar95;
            *(double *)((long)pdVar61 + lVar70) =
                 (((dVar17 + dVar84) - dVar18) - dVar81) * dVar98 +
                 (dVar93 + dVar99) * 0.5 + dVar13 + dVar14 + dVar102;
            *(double *)((long)pdVar30 + lVar70) =
                 dVar82 + (dVar7 + dVar9) * 0.5 + dVar83 + dVar101 + dVar88;
            *(double *)((long)pdVar78 + lVar70) =
                 dVar15 * dVar98 + dVar102 + (dVar8 + dVar6) * 0.5 + dVar83 + dVar101;
            dVar83 = ((dVar104 + dVar4) - dVar2) - dVar89;
            dStack_4c0 = auVar11._8_8_;
            dVar82 = ((dVar86 + dVar99) - dVar93) - dVar103;
            dVar14 = dVar105 * dVar82;
            dVar15 = dVar105 * dVar92;
            dStack_670 = auVar10._8_8_;
            dVar2 = ((dVar17 + dVar19) - dVar81) - dVar21;
            dVar13 = ((dVar18 + dVar20) - dVar84) - dVar22;
            *(double *)((long)pdVar64 + lVar70) =
                 dVar90 * dVar13 +
                 dVar100 * dVar2 + dVar92 * dVar94 + (dVar89 + dVar104) * 0.5 + dVar14;
            ((double *)((long)pdVar64 + lVar70))[1] =
                 dVar90 * dVar2 +
                 dVar100 * dVar13 + dVar92 * dStack_670 + (dVar4 + dStack_4c0) * 0.5 + dVar14;
            dVar104 = dVar2 * dVar90 +
                      dVar13 * dVar100 + dVar82 * dVar94 + (dVar5 + dVar3) * 0.5 + dVar15;
            auVar12._8_4_ = SUB84(dVar104,0);
            auVar12._0_8_ =
                 dVar13 * dVar90 +
                 dVar2 * dVar100 + dVar82 * dStack_670 + (dVar106 + dVar1) * 0.5 + dVar15;
            auVar12._12_4_ = (int)((ulong)dVar104 >> 0x20);
            *(undefined1 (*) [16])((long)pdVar42 + lVar70) = auVar12;
            dVar103 = ((dVar86 + dVar9) - dVar7) - dVar103;
            dVar104 = dVar85 * dVar103;
            dVar99 = ((dVar93 + dVar6) - dVar8) - dVar99;
            dVar89 = dVar87 * dVar99;
            dVar86 = dVar91 * dVar83;
            dVar106 = ((dVar1 + dVar5) - dVar3) - dVar106;
            dVar93 = dVar80 * dVar106;
            *(double *)((long)local_3e0 + lVar70 + -8) =
                 (dVar17 + dVar81) * 0.5 + dVar104 + dVar89 + dVar86 + dVar93;
            dVar106 = dVar106 * dVar91;
            dVar83 = dVar83 * dVar80;
            *(double *)((long)local_3d8 + lVar70 + -8) =
                 (dVar21 + dVar19) * 0.5 + dVar104 + dVar89 + dVar106 + dVar83;
            dVar99 = dVar99 * dVar85;
            dVar103 = dVar103 * dVar87;
            *(double *)((long)local_3e0 + lVar70) =
                 (dVar18 + dVar84) * 0.5 + dVar99 + dVar103 + dVar86 + dVar93;
            *(double *)((long)local_3d8 + lVar70) =
                 (dVar22 + dVar20) * 0.5 + dVar99 + dVar103 + dVar106 + dVar83;
            lVar70 = lVar70 + (long)iVar67 * 8;
            iVar31 = iVar31 + iVar67;
            iVar47 = iVar47 + -1;
          } while (iVar47 != 0);
        }
        local_3d8 = local_3d8 + lVar72;
        pdVar29 = pdVar29 + lVar72;
        local_6a8 = local_6a8 + lVar72;
        local_3e0 = local_3e0 + lVar72;
        pdVar68 = pdVar68 + lVar72;
        local_6a0 = local_6a0 + lVar72;
        pdVar78 = pdVar78 + lVar49;
        pdVar61 = pdVar61 + lVar49;
        pdVar30 = pdVar30 + lVar49;
        pdVar69 = pdVar69 + lVar49;
        local_63c = local_63c + iVar25;
        pdVar58 = pdVar58 + lVar55;
        pdVar71 = pdVar71 + lVar55;
        pdVar42 = pdVar42 + lVar55;
        pdVar64 = pdVar64 + lVar55;
      }
      local_410 = local_410 + lVar26;
      local_640 = local_640 + iVar25;
      local_408 = local_408 + lVar26;
      pdVar45 = pdVar45 + lVar26;
      pdVar43 = pdVar43 + lVar26;
      pdVar77 = pdVar77 + lVar48;
      pdVar60 = pdVar60 + lVar48;
      pdVar59 = pdVar59 + lVar48;
      pdVar57 = pdVar57 + lVar48;
      local_3f0 = local_3f0 + lVar65;
      pdVar54 = pdVar54 + lVar65;
      pdVar51 = pdVar51 + lVar65;
      pdVar41 = pdVar41 + lVar65;
      pdVar35 = pdVar35 + lVar65;
      local_3e8 = local_3e8 + lVar65;
    }
    local_448 = local_448 + finearr.arr[2].nstride;
    local_418 = local_418 + finearr.arr[2].nstride;
    local_438 = local_438 + finearr.arr[2].nstride;
    local_450 = local_450 + finearr.arr[2].nstride;
    local_420 = local_420 + finearr.arr[2].nstride;
    local_440 = local_440 + finearr.arr[2].nstride;
    local_488 = local_488 + finearr.arr[0].nstride;
    local_490 = local_490 + finearr.arr[0].nstride;
    local_498 = local_498 + finearr.arr[0].nstride;
    local_4a0 = local_4a0 + finearr.arr[0].nstride;
    local_468 = local_468 + finearr.arr[1].nstride;
    local_478 = local_478 + finearr.arr[1].nstride;
    local_480 = local_480 + finearr.arr[1].nstride;
    local_470 = local_470 + finearr.arr[1].nstride;
    local_460 = local_460 + finearr.arr[1].nstride;
    local_458 = local_458 + finearr.arr[1].nstride;
  }
  return;
}

Assistant:

void
FaceDivFree::interp_arr (Array<FArrayBox*, AMREX_SPACEDIM> const& crse,
                         const int         crse_comp,
                         Array<FArrayBox*, AMREX_SPACEDIM> const& fine,
                         const int         fine_comp,
                         const int         ncomp,
                         const Box&        fine_region,
                         const IntVect&    ratio,
                         Array<IArrayBox*, AMREX_SPACEDIM> const& solve_mask,
                         const Geometry&   /*crse_geom */,
                         const Geometry&   fine_geom,
                         Vector<Array<BCRec, AMREX_SPACEDIM> > const& /*bcr*/,
                         const int         /*actual_comp*/,
                         const int         /*actual_state*/,
                         const RunOn       runon)
{
    BL_PROFILE("FaceDivFree::interp()");

    Array<IndexType, AMREX_SPACEDIM> types;
    for (int d=0; d<AMREX_SPACEDIM; ++d)
        { types[d].set(d); }

    // This is currently only designed for octree, where ratio = 2.
    AMREX_ALWAYS_ASSERT(ratio == 2);

    const Box c_fine_region = amrex::coarsen(fine_region, ratio);
    GpuArray<Real, AMREX_SPACEDIM> cell_size = fine_geom.CellSizeArray();

    GpuArray<Array4<const Real>, AMREX_SPACEDIM> crsearr;
    GpuArray<Array4<Real>, AMREX_SPACEDIM> finearr;
    GpuArray<Array4<const int>, AMREX_SPACEDIM> maskarr;
    for (int d=0; d<AMREX_SPACEDIM; ++d)
    {
        crsearr[d] = crse[d]->const_array(crse_comp);
        finearr[d] = fine[d]->array(fine_comp);
        if (solve_mask[d] != nullptr)
            { maskarr[d] = solve_mask[d]->const_array(0); }
    }

    // Fuse the launches, 1 for each dimension, into a single launch.
    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM_FLAG(runon,
              amrex::convert(c_fine_region,types[0]), bx0,
              {
                  AMREX_LOOP_3D(bx0, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          amrex::facediv_face_interp<Real> (i,j,k,crse_comp+n,fine_comp+n, 0,
                                                            crsearr[0], finearr[0], maskarr[0], ratio);
                      }
                  });
              },
              amrex::convert(c_fine_region,types[1]), bx1,
              {
                  AMREX_LOOP_3D(bx1, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          amrex::facediv_face_interp<Real> (i,j,k,crse_comp+n,fine_comp+n, 1,
                                                            crsearr[1], finearr[1], maskarr[1], ratio);
                      }
                  });
              },
              amrex::convert(c_fine_region,types[2]), bx2,
              {
                  AMREX_LOOP_3D(bx2, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          amrex::facediv_face_interp<Real> (i,j,k,crse_comp+n,fine_comp+n, 2,
                                                            crsearr[2], finearr[2], maskarr[2], ratio);
                      }
                  });
              });

    AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,c_fine_region,ncomp,i,j,k,n,
    {
        amrex::facediv_int<Real>(i, j, k, fine_comp+n, finearr, ratio, cell_size);
    });
}